

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt * __thiscall llvm::APInt::operator--(APInt *this)

{
  APInt *pAVar1;
  
  if ((ulong)this->BitWidth < 0x41) {
    (this->U).pVal = (uint64_t *)((this->U).VAL - 1);
  }
  else {
    tcDecrement((this->U).pVal,(uint)((ulong)this->BitWidth + 0x3f >> 6));
  }
  pAVar1 = clearUnusedBits(this);
  return pAVar1;
}

Assistant:

APInt& APInt::operator--() {
  if (isSingleWord())
    --U.VAL;
  else
    tcDecrement(U.pVal, getNumWords());
  return clearUnusedBits();
}